

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# switches.cpp
# Opt level: O1

pair<switches,_int> *
get_switches(pair<switches,_int> *__return_storage_ptr__,int argc,tchar **argv)

{
  pointer pcVar1;
  bool bVar2;
  switches result;
  int local_6c;
  undefined1 local_68 [32];
  _Alloc_hider local_48;
  size_type local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  uint local_28;
  bool local_24;
  
  pcVar1 = local_68 + 0x10;
  local_68._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"pstore read utility\n","");
  bVar2 = pstore::command_line::details::
          parse_command_line_options<char*const*,std::ostream,std::ostream>
                    (argv,argv + argc,(string *)local_68,
                     (basic_ostream<char,_std::char_traits<char>_> *)&std::cout,
                     (basic_ostream<char,_std::char_traits<char>_> *)&std::cerr);
  if (bVar2) {
    if ((pointer)local_68._0_8_ != pcVar1) {
      operator_delete((void *)local_68._0_8_,CONCAT71(local_68._17_7_,local_68[0x10]) + 1);
    }
    local_68._8_8_ = 0;
    local_68[0x10] = '\0';
    local_40 = 0;
    local_38._M_local_buf[0] = '\0';
    local_24 = false;
    local_28 = (anonymous_namespace)::revision_abi_cxx11_._136_4_;
    local_68._0_8_ = pcVar1;
    local_48._M_p = (pointer)&local_38;
    std::__cxx11::string::_M_assign((string *)local_68);
    std::__cxx11::string::_M_assign((string *)&local_48);
    local_24 = (bool)(anonymous_namespace)::string_mode[0x88];
    local_6c = 0;
    std::pair<switches,_int>::pair<switches_&,_int,_true>
              (__return_storage_ptr__,(switches *)local_68,&local_6c);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_p != &local_38) {
      operator_delete(local_48._M_p,
                      CONCAT71(local_38._M_allocated_capacity._1_7_,local_38._M_local_buf[0]) + 1);
    }
    if ((pointer)local_68._0_8_ != pcVar1) {
      operator_delete((void *)local_68._0_8_,CONCAT71(local_68._17_7_,local_68[0x10]) + 1);
    }
    return __return_storage_ptr__;
  }
  exit(1);
}

Assistant:

std::pair<switches, int> get_switches (int argc, tchar * argv[]) {
    parse_command_line_options (argc, argv, "pstore read utility\n");

    switches result;
    result.revision = static_cast<unsigned> (revision.get ());
    result.db_path = db_path.get ();
    result.key = key.get ();
    result.string_mode = string_mode.get ();

    return {result, EXIT_SUCCESS};
}